

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::TryToChangeDirectory(cmCTest *this,string *dir)

{
  ostream *poVar1;
  Kind KVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  Status status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Internal ctest changing into directory: ");
  poVar1 = std::operator<<(poVar1,(string *)dir);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x653,msg._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  status = cmsys::SystemTools::ChangeDirectory(dir);
  KVar2 = status.Kind_;
  if (KVar2 != Success) {
    std::operator+(&local_1b8,"Failed to change working directory to \"",dir);
    std::operator+(&local_220,&local_1b8,"\" : ");
    cmsys::Status::GetString_abi_cxx11_(&local_1d8,&status);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&local_220,&local_1d8);
    std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &cmCTestLog_msg,"\n");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x658,local_220._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return KVar2 == Success;
}

Assistant:

bool cmCTest::TryToChangeDirectory(std::string const& dir)
{
  cmCTestLog(this, OUTPUT,
             "Internal ctest changing into directory: " << dir << std::endl);
  cmsys::Status status = cmSystemTools::ChangeDirectory(dir);
  if (!status) {
    auto msg = "Failed to change working directory to \"" + dir +
      "\" : " + status.GetString() + "\n";
    cmCTestLog(this, ERROR_MESSAGE, msg);
    return false;
  }
  return true;
}